

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O1

int64_t __thiscall
disruptor::BusySpinStrategy::WaitFor
          (BusySpinStrategy *this,int64_t *sequence,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          atomic<bool> *alerted)

{
  long lVar1;
  bool bVar2;
  function<long_()> min_sequence;
  Sequence *local_48;
  undefined8 uStack_40;
  code *local_38;
  code *pcStack_30;
  
  bVar2 = (dependents->
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)._M_impl
          .super__Vector_impl_data._M_finish !=
          (dependents->
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)._M_impl
          .super__Vector_impl_data._M_start;
  uStack_40 = 0;
  if (bVar2) {
    cursor = (Sequence *)dependents;
  }
  pcStack_30 = std::
               _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:383:12)>
               ::_M_invoke;
  if (!bVar2) {
    pcStack_30 = std::
                 _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:381:12)>
                 ::_M_invoke;
  }
  local_38 = std::
             _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:383:12)>
             ::_M_manager;
  local_48 = cursor;
  if (!bVar2) {
    local_38 = std::
               _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:381:12)>
               ::_M_manager;
  }
  do {
    lVar1 = (*pcStack_30)(&local_48);
    if (*sequence <= lVar1) goto LAB_00113e65;
    if (((alerted->_M_base)._M_i & 1U) != 0) goto LAB_00113e5e;
  } while (local_38 != (code *)0x0);
  std::__throw_bad_function_call();
LAB_00113e5e:
  lVar1 = -2;
LAB_00113e65:
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return lVar1;
}

Assistant:

int64_t WaitFor(const int64_t& sequence, const Sequence& cursor,
                  const std::vector<Sequence*>& dependents,
                  const std::atomic<bool>& alerted) {
    int64_t available_sequence = kInitialCursorValue;
    const auto min_sequence = buildMinSequenceFunction(cursor, dependents);

    while ((available_sequence = min_sequence()) < sequence) {
      if (alerted.load()) return kAlertedSignal;

      SpinPause();
    }

    return available_sequence;
  }